

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

int __thiscall
CEditor::UiDoValueSelector
          (CEditor *this,void *pID,CUIRect *pRect,char *pLabel,int Current,int Min,int Max,int Step,
          float Scale,char *pToolTip)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  CUI *pCVar4;
  IInput *pIVar5;
  void *pvVar6;
  undefined8 in_RCX;
  long in_RDX;
  void *in_RSI;
  CEditor *in_RDI;
  uint in_R8D;
  uint in_R9D;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float fVar7;
  double dVar8;
  uint in_stack_00000008;
  int in_stack_00000010;
  char *in_stack_00000018;
  int Count;
  bool Inside;
  char aBuf [128];
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  CUI *in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff23;
  float in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  uint uVar9;
  int in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  vec4 *in_stack_ffffffffffffff80;
  CUIRect *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UI(in_RDI);
  bVar2 = CUI::MouseInside(in_stack_ffffffffffffff10,
                           (CUIRect *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
  ;
  uVar9 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff38);
  pCVar4 = UI(in_RDI);
  bVar2 = CUI::CheckActiveItem(pCVar4,in_RSI);
  if (!bVar2) {
    pCVar4 = UI(in_RDI);
    pvVar6 = CUI::HotItem(pCVar4);
    if (pvVar6 == in_RSI) {
      pCVar4 = UI(in_RDI);
      bVar2 = CUI::MouseButton(pCVar4,0);
      if (bVar2) {
        in_RDI->m_LockMouse = true;
        UiDoValueSelector::s_Value = 0.0;
        pCVar4 = UI(in_RDI);
        CUI::SetActiveItem(pCVar4,in_RSI);
      }
      if (in_stack_00000018 != (char *)0x0) {
        in_RDI->m_pTooltip = in_stack_00000018;
      }
    }
    goto LAB_001ec2f1;
  }
  pCVar4 = UI(in_RDI);
  bVar2 = CUI::MouseButton(pCVar4,0);
  if (bVar2) {
    pIVar5 = Input(in_RDI);
    uVar3 = (*(pIVar5->super_IInterface)._vptr_IInterface[5])(pIVar5,0x1b,0);
    if ((uVar3 & 1) != 0) goto LAB_001ec122;
    pIVar5 = Input(in_RDI);
    uVar3 = (*(pIVar5->super_IInterface)._vptr_IInterface[4])(pIVar5,0x161);
    if ((uVar3 & 1) == 0) {
      pIVar5 = Input(in_RDI);
      uVar3 = (*(pIVar5->super_IInterface)._vptr_IInterface[4])(pIVar5,0x165);
      if ((uVar3 & 1) != 0) goto LAB_001ec17e;
      UiDoValueSelector::s_Value = in_RDI->m_MouseDeltaX + UiDoValueSelector::s_Value;
    }
    else {
LAB_001ec17e:
      UiDoValueSelector::s_Value = in_RDI->m_MouseDeltaX * 0.05 + UiDoValueSelector::s_Value;
    }
    fVar7 = absolute<float>(UiDoValueSelector::s_Value);
    if (in_XMM0_Da < fVar7) {
      in_stack_ffffffffffffff34 = (int)(UiDoValueSelector::s_Value / in_XMM0_Da);
      dVar8 = std::fmod((double)(ulong)(uint)UiDoValueSelector::s_Value,
                        (double)(ulong)(uint)in_XMM0_Da);
      UiDoValueSelector::s_Value = SUB84(dVar8,0);
      in_R8D = in_stack_00000010 * in_stack_ffffffffffffff34 + in_R8D;
      if ((int)in_R8D < (int)in_R9D) {
        in_R8D = in_R9D;
      }
      if ((int)in_stack_00000008 < (int)in_R8D) {
        in_R8D = in_stack_00000008;
      }
    }
  }
  else {
LAB_001ec122:
    in_RDI->m_LockMouse = false;
    pCVar4 = UI(in_RDI);
    CUI::SetActiveItem(pCVar4,(void *)0x0);
  }
  if (in_stack_00000018 != (char *)0x0) {
    in_RDI->m_pTooltip = in_stack_00000018;
  }
LAB_001ec2f1:
  if ((uVar9 & 0x1000000) != 0) {
    pCVar4 = UI(in_RDI);
    CUI::SetHotItem(pCVar4,in_RSI);
  }
  str_format(&stack0xffffffffffffff78,0x80,"%s %d",in_RCX,(ulong)in_R8D);
  GetButtonColor((CEditor *)CONCAT44(in_XMM0_Da,uVar9),
                 (void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (int)((ulong)in_RDI >> 0x20));
  CUIRect::Draw(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                in_stack_ffffffffffffff78);
  *(float *)(in_RDX + 4) = *(float *)(in_RDX + 4) + *(float *)(in_RDX + 0xc) * 0.5 + -7.0;
  UI(in_RDI);
  CUI::DoLabel((CUI *)CONCAT44(in_R8D,in_R9D),(CUIRect *)CONCAT44(in_XMM0_Da,uVar9),
               (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (float)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffff24,
               (bool)in_stack_ffffffffffffff23);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_R8D;
}

Assistant:

int CEditor::UiDoValueSelector(void *pID, CUIRect *pRect, const char *pLabel, int Current, int Min, int Max, int Step, float Scale, const char *pToolTip)
{
	// logic
	static float s_Value;
	bool Inside = UI()->MouseInside(pRect);

	if(UI()->CheckActiveItem(pID))
	{
		if(!UI()->MouseButton(0) || Input()->KeyPress(KEY_ESCAPE))
		{
			m_LockMouse = false;
			UI()->SetActiveItem(0);
		}
		else
		{
			if(Input()->KeyIsPressed(KEY_LSHIFT) || Input()->KeyIsPressed(KEY_RSHIFT))
				s_Value += m_MouseDeltaX*0.05f;
			else
				s_Value += m_MouseDeltaX;

			if(absolute(s_Value) > Scale)
			{
				int Count = (int)(s_Value/Scale);
				s_Value = fmod(s_Value, Scale);
				Current += Step*Count;
				if(Current < Min)
					Current = Min;
				if(Current > Max)
					Current = Max;
			}
		}
		if(pToolTip)
			m_pTooltip = pToolTip;
	}
	else if(UI()->HotItem() == pID)
	{
		if(UI()->MouseButton(0))
		{
			m_LockMouse = true;
			s_Value = 0;
			UI()->SetActiveItem(pID);
		}
		if(pToolTip)
			m_pTooltip = pToolTip;
	}

	if(Inside)
		UI()->SetHotItem(pID);

	// render
	char aBuf[128];
	str_format(aBuf, sizeof(aBuf),"%s %d", pLabel, Current);
	pRect->Draw(GetButtonColor(pID, 0));
	pRect->y += pRect->h/2.0f-7.0f;
	UI()->DoLabel(pRect, aBuf, 10, TEXTALIGN_CENTER);

	return Current;
}